

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall
TypeOpIntRight::getInputCast(TypeOpIntRight *this,PcodeOp *op,int4 slot,CastStrategy *castStrategy)

{
  int iVar1;
  Datatype *pDVar2;
  Varnode *this_00;
  HighVariable *this_01;
  Datatype *pDVar3;
  undefined4 extraout_var;
  Datatype *curtype;
  Datatype *reqtype;
  CastStrategy *castStrategy_local;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOpIntRight *this_local;
  
  if (slot == 0) {
    pDVar2 = PcodeOp::inputTypeLocal(op,0);
    this_00 = PcodeOp::getIn(op,0);
    this_01 = Varnode::getHigh(this_00);
    pDVar3 = HighVariable::getType(this_01);
    iVar1 = (*castStrategy->_vptr_CastStrategy[6])(castStrategy,pDVar2,pDVar3,1);
    this_local = (TypeOpIntRight *)CONCAT44(extraout_var,iVar1);
  }
  else {
    this_local = (TypeOpIntRight *)TypeOp::getInputCast((TypeOp *)this,op,slot,castStrategy);
  }
  return (Datatype *)this_local;
}

Assistant:

Datatype *TypeOpIntRight::getInputCast(const PcodeOp *op,int4 slot,const CastStrategy *castStrategy) const

{
  if (slot == 0) {
    Datatype *reqtype = op->inputTypeLocal(slot);
    Datatype *curtype = op->getIn(slot)->getHigh()->getType();
    return castStrategy->castStandard(reqtype,curtype,true,true);
  }
  return TypeOpBinary::getInputCast(op,slot,castStrategy);
}